

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sokol_app.h
# Opt level: O3

void sapp_set_icon(sapp_icon_desc *desc)

{
  char cVar1;
  undefined4 uVar2;
  size_t sVar3;
  void *pvVar4;
  sapp_icon_desc *psVar5;
  sapp_image_desc *psVar6;
  wchar_t img_index;
  ulong uVar7;
  uint32_t *puVar8;
  long *__ptr;
  long lVar9;
  long *plVar10;
  int iVar11;
  size_t *psVar12;
  undefined4 uVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  int *piVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  char cVar22;
  wchar_t x;
  ulong uVar23;
  int *piVar24;
  bool bVar25;
  bool bVar26;
  
  if (desc == (sapp_icon_desc *)0x0) {
    __assert_fail("desc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                  ,0x2f4b,"void sapp_set_icon(const sapp_icon_desc *)");
  }
  if ((desc->sokol_default == true) &&
     (desc = &_sapp.default_icon_desc, _sapp.default_icon_pixels == (uint32_t *)0x0)) {
    puVar8 = (uint32_t *)_sapp_malloc_clear(0x5400);
    psVar12 = &_sapp.default_icon_desc.images[0].pixels.size;
    lVar15 = 0;
    lVar9 = 0;
    _sapp.default_icon_pixels = puVar8;
    do {
      iVar19 = *(int *)((long)&DAT_0019e6a0 + lVar15);
      *(int *)(psVar12 + -2) = iVar19;
      *(int *)((long)psVar12 + -0xc) = iVar19;
      ((sapp_range *)(psVar12 + -1))->ptr = (void *)((long)puVar8 + lVar9);
      *psVar12 = (ulong)(uint)(iVar19 * iVar19) * 4;
      lVar9 = lVar9 + (ulong)(uint)(iVar19 * iVar19) * 4;
      lVar15 = lVar15 + 4;
      psVar12 = psVar12 + 3;
    } while (lVar15 != 0xc);
    lVar9 = 0;
    lVar15 = 0;
    do {
      iVar19 = (&DAT_0019e6a0)[lVar9];
      iVar11 = iVar19 + 7;
      if (-1 < iVar19) {
        iVar11 = iVar19;
      }
      iVar11 = iVar11 >> 3;
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      lVar21 = 0;
      do {
        uVar2 = (&DAT_001a5660)[lVar21];
        cVar1 = (&DAT_001a13f5)[lVar21];
        iVar19 = 0;
        do {
          iVar20 = 0;
          cVar22 = cVar1;
          do {
            iVar18 = iVar11;
            uVar13 = uVar2;
            if (-1 < cVar22) {
              uVar13 = 0xffffff;
            }
            do {
              if (0x53ff < lVar15) {
                __assert_fail("dst < dst_end",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                              ,0xc3a,"void _sapp_setup_default_icon(void)");
              }
              *(undefined4 *)((long)puVar8 + lVar15) = uVar13;
              lVar15 = lVar15 + 4;
              iVar18 = iVar18 + -1;
            } while (iVar18 != 0);
            iVar20 = iVar20 + 1;
            cVar22 = cVar22 * '\x02';
          } while (iVar20 != 8);
          iVar19 = iVar19 + 1;
        } while (iVar19 != iVar11);
        lVar21 = lVar21 + 1;
      } while (lVar21 != 8);
      lVar9 = lVar9 + 1;
    } while (lVar9 != 3);
    if (lVar15 != 0x5400) {
      __assert_fail("dst == dst_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                    ,0xc41,"void _sapp_setup_default_icon(void)");
    }
    lVar15 = 0;
    lVar9 = 0;
    do {
      uVar14 = (&DAT_0019e6a0)[lVar15];
      uVar7 = 1;
      if (1 < (int)uVar14) {
        uVar7 = (ulong)uVar14;
      }
      lVar21 = (long)puVar8 + lVar9;
      uVar16 = 0;
      do {
        uVar23 = 0;
        iVar19 = 0xffffff;
        do {
          iVar11 = *(int *)(lVar21 + uVar23 * 4);
          if (iVar19 != 0xffffff && iVar11 == 0xffffff) {
            *(undefined4 *)(lVar21 + uVar23 * 4) = 0xff000000;
          }
          uVar23 = uVar23 + 1;
          iVar19 = iVar11;
        } while (uVar7 != uVar23);
        uVar16 = uVar16 + 1;
        lVar21 = lVar21 + (long)(int)uVar14 * 4;
      } while (uVar16 != uVar7);
      lVar9 = lVar9 + (ulong)(uVar14 * uVar14) * 4;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    if (lVar9 != 0x5400) {
      __assert_fail("dst == dst_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                    ,0xc54,"void _sapp_setup_default_icon(void)");
    }
    lVar15 = 0;
    lVar9 = 0;
    do {
      uVar14 = (&DAT_0019e6a0)[lVar15];
      uVar7 = 1;
      if (1 < (int)uVar14) {
        uVar7 = (ulong)uVar14;
      }
      piVar17 = (int *)((long)puVar8 + lVar9);
      uVar16 = 0;
      do {
        uVar23 = uVar7;
        piVar24 = piVar17;
        iVar19 = 0xffffff;
        do {
          iVar11 = *piVar24;
          if (iVar19 != 0xffffff && iVar11 == 0xffffff) {
            *piVar24 = -0x1000000;
          }
          piVar24 = piVar24 + (int)uVar14;
          uVar23 = uVar23 - 1;
          iVar19 = iVar11;
        } while (uVar23 != 0);
        uVar16 = uVar16 + 1;
        piVar17 = piVar17 + 1;
      } while (uVar16 != uVar7);
      lVar9 = lVar9 + (ulong)(uVar14 * uVar14) * 4;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 3);
    if (lVar9 != 0x5400) {
      __assert_fail("dst == dst_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                    ,0xc67,"void _sapp_setup_default_icon(void)");
    }
  }
  psVar6 = desc->images;
  uVar7 = 0;
  do {
    if ((psVar6->pixels).ptr == (void *)0x0) {
      if (uVar7 == 0) {
        return;
      }
      if (8 < uVar7) {
        __assert_fail("(num_images > 0) && (num_images <= SAPP_MAX_ICONIMAGES)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                      ,0x2f57,"void sapp_set_icon(const sapp_icon_desc *)");
      }
      goto LAB_0010bfe0;
    }
    uVar7 = uVar7 + 1;
    psVar6 = (sapp_image_desc *)(&psVar6->pixels + 1);
  } while (uVar7 != 8);
  uVar7 = 8;
LAB_0010bfe0:
  uVar23 = uVar7 & 0xffffffff;
  bVar25 = false;
  uVar16 = 1;
  psVar5 = desc;
  while( true ) {
    psVar12 = &psVar5->images[0].pixels.size;
    iVar19 = psVar5->images[0].width;
    if (iVar19 < 1) {
      __assert_fail("desc->width > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                    ,0xbc8,"_Bool _sapp_image_validate(const sapp_image_desc *)");
    }
    iVar11 = psVar5->images[0].height;
    if (iVar11 < 1) {
      __assert_fail("desc->height > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                    ,0xbc9,"_Bool _sapp_image_validate(const sapp_image_desc *)");
    }
    if (psVar5->images[0].pixels.ptr == (void *)0x0) {
      __assert_fail("desc->pixels.ptr != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                    ,0xbca,"_Bool _sapp_image_validate(const sapp_image_desc *)");
    }
    sVar3 = *psVar12;
    if (sVar3 == 0) {
      __assert_fail("desc->pixels.size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                    ,0xbcb,"_Bool _sapp_image_validate(const sapp_image_desc *)");
    }
    if ((ulong)(uint)(iVar11 * iVar19) << 2 != sVar3) break;
    bVar25 = uVar23 <= uVar16;
    bVar26 = uVar16 == uVar23;
    uVar16 = uVar16 + 1;
    psVar5 = (sapp_icon_desc *)psVar12;
    if (bVar26) {
LAB_0010c2e2:
      if (0 < (int)uVar7) {
        lVar9 = 0;
        iVar19 = 0;
        do {
          iVar19 = iVar19 + *(int *)((long)&desc->images[0].height + lVar9) *
                            *(int *)((long)&desc->images[0].width + lVar9) + 2;
          lVar9 = lVar9 + 0x18;
        } while (uVar23 * 0x18 != lVar9);
        __ptr = (long *)_sapp_malloc_clear((long)iVar19 << 3);
        uVar7 = 0;
        plVar10 = __ptr;
        do {
          pvVar4 = desc->images[uVar7].pixels.ptr;
          iVar11 = desc->images[uVar7].width;
          *plVar10 = (long)iVar11;
          iVar20 = desc->images[uVar7].height;
          plVar10[1] = (long)iVar20;
          plVar10 = plVar10 + 2;
          uVar14 = iVar20 * iVar11;
          if (0 < (int)uVar14) {
            lVar9 = 0;
            uVar16 = 0;
            do {
              plVar10[uVar16] =
                   (ulong)*(byte *)((long)pvVar4 + uVar16 * 4 + 3) << 0x18 |
                   (ulong)*(byte *)((long)pvVar4 + uVar16 * 4 + 2) |
                   (ulong)((uint)*(byte *)((long)pvVar4 + uVar16 * 4 + 1) << 8 |
                          (uint)*(byte *)((long)pvVar4 + uVar16 * 4) << 0x10);
              uVar16 = uVar16 + 1;
              lVar9 = lVar9 + -8;
            } while (uVar14 != uVar16);
            plVar10 = (long *)((long)plVar10 - lVar9);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != uVar23);
        XChangeProperty(_sapp.x11.display,_sapp.x11.window,_sapp.x11.NET_WM_ICON,6,0x20,0,__ptr,
                        iVar19);
        if (_sapp.desc.allocator.free == (_func_void_void_ptr_void_ptr *)0x0) {
          free(__ptr);
        }
        else {
          (*_sapp.desc.allocator.free)(__ptr,_sapp.desc.allocator.user_data);
        }
        XFlush(_sapp.x11.display);
        return;
      }
      __assert_fail("size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O3/_deps/sokol-src/sokol_app.h"
                    ,0xabe,"void *_sapp_malloc(size_t)");
    }
  }
  if (_sapp.desc.logger.log_cb == (_func_void_char_ptr_void_ptr *)0x0) {
    puts("Image data size mismatch (must be width*height*4 bytes)\n");
  }
  else {
    (*_sapp.desc.logger.log_cb)
              ("Image data size mismatch (must be width*height*4 bytes)\n",
               _sapp.desc.logger.user_data);
  }
  if (!bVar25) {
    return;
  }
  goto LAB_0010c2e2;
}

Assistant:

SOKOL_API_IMPL void sapp_set_icon(const sapp_icon_desc* desc) {
    SOKOL_ASSERT(desc);
    if (desc->sokol_default) {
        if (0 == _sapp.default_icon_pixels) {
            _sapp_setup_default_icon();
        }
        SOKOL_ASSERT(0 != _sapp.default_icon_pixels);
        desc = &_sapp.default_icon_desc;
    }
    const int num_images = _sapp_icon_num_images(desc);
    if (num_images == 0) {
        return;
    }
    SOKOL_ASSERT((num_images > 0) && (num_images <= SAPP_MAX_ICONIMAGES));
    if (!_sapp_validate_icon_desc(desc, num_images)) {
        return;
    }
    #if defined(_SAPP_MACOS)
        _sapp_macos_set_icon(desc, num_images);
    #elif defined(_SAPP_WIN32)
        _sapp_win32_set_icon(desc, num_images);
    #elif defined(_SAPP_LINUX)
        _sapp_x11_set_icon(desc, num_images);
    #elif defined(_SAPP_EMSCRIPTEN)
        _sapp_emsc_set_icon(desc, num_images);
    #endif
}